

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O3

int reduce_pp_expression(Context_conflict1 *ctx)

{
  int iVar1;
  IncludeState *s;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  Token TVar5;
  Token TVar6;
  Define *pDVar7;
  bool bVar8;
  long lVar9;
  char *pcVar10;
  Token *pTVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  Token stack [64];
  RpnTokens output [128];
  undefined8 local_948;
  IncludeState *local_940;
  ulong local_938 [127];
  Token aTStack_53c [65];
  Token local_438 [258];
  
  local_940 = ctx->include_stack;
  uVar14 = 0;
  uVar12 = 0;
  TVar5 = TOKEN_UNKNOWN;
LAB_00130d6f:
  do {
    s = ctx->include_stack;
    if (s->pushedback == 0) {
      TVar6 = preprocessor_lexer(s);
    }
    else {
      s->pushedback = 0;
      TVar6 = s->tokenval;
    }
    bVar8 = false;
    if ((int)TVar6 < 0x2d) {
      if (TVar6 == 0x21) goto LAB_00130f36;
      if (TVar6 != 0x2b) goto LAB_00130f34;
      bVar8 = TVar5 == 0x29 || TVar5 == TOKEN_INT_LITERAL;
      TVar6 = 0x2b;
      if ((TVar5 != 0x29) && (TVar5 != TOKEN_INT_LITERAL)) {
        TVar6 = TOKEN_PP_UNARY_PLUS;
      }
LAB_00130e23:
      ctx->recursion_count = 0;
      goto LAB_00130e2d;
    }
    if (TVar6 == TOKEN_IDENTIFIER) break;
    if (TVar6 != 0x7e) {
      if (TVar6 == 0x2d) {
        bVar8 = TVar5 == 0x29 || TVar5 == TOKEN_INT_LITERAL;
        TVar6 = 0x2d;
        if ((TVar5 != 0x29) && (TVar5 != TOKEN_INT_LITERAL)) {
          TVar6 = TOKEN_PP_UNARY_MINUS;
        }
        goto LAB_00130e23;
      }
LAB_00130f34:
      bVar8 = true;
    }
LAB_00130f36:
    ctx->recursion_count = 0;
    if ((int)TVar6 < 0x102) {
      if (TVar6 == 0x28) {
        if (0x3f < uVar12) {
          __assert_fail("stacksize < STATICARRAYLEN(stack)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                        ,0x6e7,"int reduce_pp_expression(Context *)");
        }
        aTStack_53c[uVar12 + 1] = 0x28;
        uVar12 = uVar12 + 1;
        TVar5 = 0x28;
      }
      else {
        uVar3 = uVar12;
        if (TVar6 == 0x29) {
          while( true ) {
            if (uVar3 == 0) goto LAB_001314cb;
            uVar12 = uVar3 - 1;
            TVar5 = aTStack_53c[uVar3];
            if (TVar5 == 0x28) break;
            if (0x7f < uVar14) {
              __assert_fail("outputsize < STATICARRAYLEN(output)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                            ,0x6f4,"int reduce_pp_expression(Context *)");
            }
            local_438[uVar14 * 2] = 1;
            local_438[uVar14 * 2 + 1] = TVar5;
            uVar14 = uVar14 + 1;
            uVar3 = uVar12;
          }
          TVar5 = 0x29;
        }
        else {
          if (TVar6 == 10) goto LAB_0013119c;
LAB_00130e2d:
          lVar9 = 0;
          while (*(Token *)(find_precedence_ops + lVar9 * 8 + 4) != TVar6) {
            lVar9 = lVar9 + 1;
            if (lVar9 == 0x16) goto LAB_00131122;
          }
          iVar4 = *(int *)(find_precedence_ops + lVar9 * 8);
          if (iVar4 < 0) {
LAB_00131122:
            if (s->pushedback != 0) {
              __assert_fail("!state->pushedback",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                            ,0x2d5,"void pushback(IncludeState *)");
            }
            s->pushedback = 1;
            goto switchD_001311eb_caseD_22;
          }
          while (uVar12 != 0) {
            TVar5 = aTStack_53c[uVar12];
            lVar9 = 0;
            while (*(Token *)(find_precedence_ops + lVar9 * 8 + 4) != TVar5) {
              lVar9 = lVar9 + 1;
              if (lVar9 == 0x16) goto LAB_00130fcf;
            }
            iVar1 = *(int *)(find_precedence_ops + lVar9 * 8);
            if (iVar1 < 0) {
LAB_00130fcf:
              if (0x3f < uVar12) {
                __assert_fail("stacksize < STATICARRAYLEN(stack)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                              ,0x71a,"int reduce_pp_expression(Context *)");
              }
              goto LAB_00130fd9;
            }
            bVar2 = iVar4 < iVar1;
            if (bVar8) {
              bVar2 = iVar4 <= iVar1;
            }
            if (!bVar2) goto LAB_00130fcf;
            if (0x7f < uVar14) {
              __assert_fail("outputsize < STATICARRAYLEN(output)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                            ,0x713,"int reduce_pp_expression(Context *)");
            }
            local_438[uVar14 * 2] = 1;
            local_438[uVar14 * 2 + 1] = TVar5;
            uVar14 = uVar14 + 1;
            uVar12 = uVar12 - 1;
          }
          uVar12 = 0;
LAB_00130fd9:
          aTStack_53c[uVar12 + 1] = TVar6;
          uVar12 = uVar12 + 1;
          TVar5 = TVar6;
        }
      }
      goto LAB_00130d6f;
    }
    if (TVar6 == TOKEN_INT_LITERAL) {
      if (0x7f < uVar14) {
        __assert_fail("outputsize < STATICARRAYLEN(output)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x6e3,"int reduce_pp_expression(Context *)");
      }
      local_438[uVar14 * 2] = 0;
      TVar5 = token_to_int(s);
      local_438[uVar14 * 2 + 1] = TVar5;
      goto LAB_00131039;
    }
    if (TVar6 != TOKEN_EOI) goto LAB_00130e2d;
    if (s == local_940) goto LAB_0013119c;
    pop_source(ctx);
  } while( true );
  iVar4 = handle_pp_identifier(ctx);
  if (iVar4 == 0) {
    if ((s->tokenlen == 7) &&
       (*(int *)((long)s->token + 3) == 0x64656e69 && *(int *)s->token == 0x69666564)) {
      if (s->pushedback == 0) {
        local_948._4_4_ = preprocessor_lexer(s);
      }
      else {
        s->pushedback = 0;
        local_948._4_4_ = s->tokenval;
      }
      TVar6 = local_948._4_4_;
      if (local_948._4_4_ == 0x28) {
        if (s->pushedback == 0) {
          TVar6 = preprocessor_lexer(s);
        }
        else {
          s->pushedback = 0;
          TVar6 = s->tokenval;
        }
      }
      if (TVar6 != TOKEN_IDENTIFIER) {
        pcVar10 = "operator \'defined\' requires an identifier";
        goto LAB_00131143;
      }
      pDVar7 = find_define_by_token(ctx);
      if (local_948._4_4_ == 0x28) {
        if (s->pushedback == 0) {
          TVar6 = preprocessor_lexer(s);
        }
        else {
          s->pushedback = 0;
          TVar6 = s->tokenval;
        }
        if (TVar6 != 0x29) goto LAB_001314cb;
      }
      if (0x7f < uVar14) {
        __assert_fail("outputsize < STATICARRAYLEN(output)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x6d9,"int reduce_pp_expression(Context *)");
      }
      local_438[uVar14 * 2] = 0;
      local_438[uVar14 * 2 + 1] = (uint)(pDVar7 != (Define *)0x0);
      uVar14 = uVar14 + 1;
    }
    else {
      if (0x7f < uVar14) {
        __assert_fail("outputsize < STATICARRAYLEN(output)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x6df,"int reduce_pp_expression(Context *)");
      }
      (local_438 + uVar14 * 2)[0] = 0;
      (local_438 + uVar14 * 2)[1] = 0;
LAB_00131039:
      uVar14 = uVar14 + 1;
      TVar5 = TOKEN_INT_LITERAL;
    }
  }
  goto LAB_00130d6f;
LAB_0013119c:
  if (uVar12 == 0) goto code_r0x001311a1;
  TVar5 = aTStack_53c[uVar12];
  if (TVar5 == 0x28) goto LAB_001314cb;
  if (0x7f < uVar14) {
    __assert_fail("outputsize < STATICARRAYLEN(output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                  ,0x729,"int reduce_pp_expression(Context *)");
  }
  uVar12 = uVar12 - 1;
  local_438[uVar14 * 2] = 1;
  local_438[uVar14 * 2 + 1] = TVar5;
  uVar14 = uVar14 + 1;
  goto LAB_0013119c;
code_r0x001311a1:
  if (0 < (int)uVar14) {
    uVar13 = (int)uVar14 + 1;
    pTVar11 = local_438 + 1;
    uVar12 = 0;
LAB_001311c2:
    if (pTVar11[-1] == 0) {
      if (0x7f < uVar12) {
        __assert_fail("stacksize < STATICARRAYLEN(stack)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x648,"long interpret_rpn(const RpnTokens *, int, int *)");
      }
      local_938[uVar12] = (long)(int)*pTVar11;
      uVar12 = uVar12 + 1;
      goto LAB_001314a0;
    }
    TVar5 = *pTVar11;
    if ((int)TVar5 < 0x7e) {
      if ((int)TVar5 < 0x3c) {
        switch(TVar5) {
        case 0x21:
          if (uVar12 != 0) {
            local_938[uVar12 - 1] = (ulong)(local_938[uVar12 - 1] == 0);
            goto LAB_001314a0;
          }
        default:
          goto switchD_001311eb_caseD_22;
        case 0x25:
          if (1 < uVar12) {
            (&local_948)[uVar12] = (long)(&local_948)[uVar12] % (long)local_938[uVar12 - 1];
            break;
          }
          goto switchD_001311eb_caseD_22;
        case 0x26:
          if (uVar12 < 2) goto switchD_001311eb_caseD_22;
          (&local_948)[uVar12] = (&local_948)[uVar12] & local_938[uVar12 - 1];
          break;
        case 0x2a:
          if (1 < uVar12) {
            lVar9 = local_938[uVar12 - 1] * (&local_948)[uVar12];
            goto LAB_00131328;
          }
          goto switchD_001311eb_caseD_22;
        case 0x2b:
          if (uVar12 < 2) goto switchD_001311eb_caseD_22;
          (&local_948)[uVar12] = (&local_948)[uVar12] + local_938[uVar12 - 1];
          break;
        case 0x2d:
          if (uVar12 < 2) goto switchD_001311eb_caseD_22;
          (&local_948)[uVar12] = (&local_948)[uVar12] - local_938[uVar12 - 1];
          break;
        case 0x2f:
          if (uVar12 < 2) goto switchD_001311eb_caseD_22;
          lVar9 = (long)(&local_948)[uVar12] / (long)local_938[uVar12 - 1];
LAB_00131328:
          (&local_948)[uVar12] = lVar9;
        }
      }
      else {
        if ((int)TVar5 < 0x5e) {
          if (TVar5 == 0x3c) {
            if (1 < uVar12) {
              uVar14 = (ulong)((long)(&local_948)[uVar12] < (long)local_938[uVar12 - 1]);
              goto LAB_00131499;
            }
            goto switchD_001311eb_caseD_22;
          }
          if ((TVar5 != 0x3e) || (uVar12 < 2)) goto switchD_001311eb_caseD_22;
          uVar14 = (ulong)((long)local_938[uVar12 - 1] < (long)(&local_948)[uVar12]);
          goto LAB_00131499;
        }
        if (TVar5 == 0x5e) {
          if (1 < uVar12) {
            (&local_948)[uVar12] = (&local_948)[uVar12] ^ local_938[uVar12 - 1];
            goto LAB_0013149d;
          }
          goto switchD_001311eb_caseD_22;
        }
        if ((TVar5 != 0x7c) || (uVar12 < 2)) goto switchD_001311eb_caseD_22;
        (&local_948)[uVar12] = (&local_948)[uVar12] | local_938[uVar12 - 1];
      }
    }
    else {
      if (300 < (int)TVar5) {
        if (TVar5 == TOKEN_PP_UNARY_MINUS) {
          if (uVar12 != 0) {
            local_938[uVar12 - 1] = -local_938[uVar12 - 1];
            goto LAB_001314a0;
          }
          goto switchD_001311eb_caseD_22;
        }
        if ((TVar5 != TOKEN_PP_UNARY_PLUS) || (uVar12 == 0)) goto switchD_001311eb_caseD_22;
        goto LAB_001314a0;
      }
      switch(TVar5) {
      case TOKEN_RSHIFT:
        if (1 < uVar12) {
          (&local_948)[uVar12] = (long)(&local_948)[uVar12] >> ((byte)local_938[uVar12 - 1] & 0x3f);
          goto LAB_0013149d;
        }
        goto switchD_001311eb_caseD_22;
      case TOKEN_LSHIFT:
        if (1 < uVar12) {
          (&local_948)[uVar12] = (&local_948)[uVar12] << ((byte)local_938[uVar12 - 1] & 0x3f);
          goto LAB_0013149d;
        }
        goto switchD_001311eb_caseD_22;
      case TOKEN_ANDAND:
        if (1 < uVar12) {
          if ((&local_948)[uVar12] == 0) {
            uVar14 = 0;
          }
          else {
LAB_001313df:
            uVar14 = (ulong)(local_938[uVar12 - 1] != 0);
          }
          goto LAB_001313ea;
        }
        goto switchD_001311eb_caseD_22;
      case TOKEN_OROR:
        if (1 < uVar12) {
          uVar14 = 1;
          if ((&local_948)[uVar12] == 0) goto LAB_001313df;
LAB_001313ea:
          (&local_948)[uVar12] = uVar14;
          uVar12 = uVar12 - 1;
          goto LAB_001314a0;
        }
        goto switchD_001311eb_caseD_22;
      case TOKEN_LEQ:
        if (uVar12 < 2) goto switchD_001311eb_caseD_22;
        uVar14 = (ulong)((long)(&local_948)[uVar12] <= (long)local_938[uVar12 - 1]);
        break;
      case TOKEN_GEQ:
        if (uVar12 < 2) goto switchD_001311eb_caseD_22;
        uVar14 = (ulong)((long)local_938[uVar12 - 1] <= (long)(&local_948)[uVar12]);
        break;
      case TOKEN_EQL:
        if (uVar12 < 2) goto switchD_001311eb_caseD_22;
        uVar14 = (ulong)((&local_948)[uVar12] == local_938[uVar12 - 1]);
        break;
      case TOKEN_NEQ:
        if (uVar12 < 2) goto switchD_001311eb_caseD_22;
        uVar14 = (ulong)((&local_948)[uVar12] != local_938[uVar12 - 1]);
        break;
      default:
        if ((TVar5 == 0x7e) && (uVar12 != 0)) {
          local_938[uVar12 - 1] = ~local_938[uVar12 - 1];
          goto LAB_001314a0;
        }
        goto switchD_001311eb_caseD_22;
      }
LAB_00131499:
      (&local_948)[uVar12] = uVar14;
    }
LAB_0013149d:
    uVar12 = uVar12 - 1;
LAB_001314a0:
    uVar13 = uVar13 - 1;
    pTVar11 = pTVar11 + 2;
    if (uVar13 < 2) goto code_r0x001314b1;
    goto LAB_001311c2;
  }
  goto switchD_001311eb_caseD_22;
LAB_001314cb:
  pcVar10 = "Unmatched \')\'";
  goto LAB_00131143;
code_r0x001314b1:
  if (uVar12 == 1) {
    return (uint)(local_938[0] != 0);
  }
switchD_001311eb_caseD_22:
  pcVar10 = "Invalid expression";
LAB_00131143:
  failf(ctx,"%s",pcVar10);
  return -1;
}

Assistant:

static int reduce_pp_expression(Context *ctx)
{
    IncludeState *orig_state = ctx->include_stack;
    RpnTokens output[128];
    Token stack[64];
    Token previous_token = TOKEN_UNKNOWN;
    size_t outputsize = 0;
    size_t stacksize = 0;
    int matched = 0;
    int done = 0;

    #define ADD_TO_OUTPUT(op, val) \
        assert(outputsize < STATICARRAYLEN(output)); \
        output[outputsize].isoperator = op; \
        output[outputsize].value = val; \
        outputsize++;

    #define PUSH_TO_STACK(t) \
        assert(stacksize < STATICARRAYLEN(stack)); \
        stack[stacksize] = t; \
        stacksize++;

    while (!done)
    {
        IncludeState *state = ctx->include_stack;
        Token token = lexer(state);
        int isleft = 1;
        int precedence = -1;

        if ( (token == ((Token) '!')) || (token == ((Token) '~')) )
            isleft = 0;
        else if (token == ((Token) '-'))
        {
            isleft = ((previous_token == TOKEN_INT_LITERAL) ||
                      (previous_token == ((Token) ')')));
            if (!isleft)
                token = TOKEN_PP_UNARY_MINUS;
        } // else if
        else if (token == ((Token) '+'))
        {
            isleft = ((previous_token == TOKEN_INT_LITERAL) ||
                      (previous_token == ((Token) ')')));
            if (!isleft)
                token = TOKEN_PP_UNARY_PLUS;
        } // else if

        if (token != TOKEN_IDENTIFIER)
            ctx->recursion_count = 0;

        switch (token)
        {
            case TOKEN_EOI:
                if (state != orig_state)  // end of a substate, or the expr?
                {
                    pop_source(ctx);
                    continue;  // substate, go again with the parent state.
                } // if
                done = 1;  // the expression itself is done.
                break;

            case ((Token) '\n'):
                done = 1;
                break;  // we're done!

            case TOKEN_IDENTIFIER:
                if (handle_pp_identifier(ctx))
                    continue;  // go again with new IncludeState.

                if ( (state->tokenlen == 7) &&
                     (memcmp(state->token, "defined", 7) == 0) )
                {
                    token = lexer(state);
                    const int paren = (token == ((Token) '('));
                    if (paren)  // gcc doesn't let us nest parens here, either.
                        token = lexer(state);
                    if (token != TOKEN_IDENTIFIER)
                    {
                        fail(ctx, "operator 'defined' requires an identifier");
                        return -1;
                    } // if
                    const int found = (find_define_by_token(ctx) != NULL);

                    if (paren)
                    {
                        if (lexer(state) != ((Token) ')'))
                        {
                            fail(ctx, "Unmatched ')'");
                            return -1;
                        } // if
                    } // if

                    ADD_TO_OUTPUT(0, found);
                    continue;
                } // if

                // can't replace identifier with a number? It becomes zero.
                token = TOKEN_INT_LITERAL;
                ADD_TO_OUTPUT(0, 0);
                break;

            case TOKEN_INT_LITERAL:
                ADD_TO_OUTPUT(0, token_to_int(state));
                break;

            case ((Token) '('):
                PUSH_TO_STACK((Token) '(');
                break;

            case ((Token) ')'):
                matched = 0;
                while (stacksize > 0)
                {
                    const Token t = stack[--stacksize];
                    if (t == ((Token) '('))
                    {
                        matched = 1;
                        break;
                    } // if
                    ADD_TO_OUTPUT(1, t);
                } // while

                if (!matched)
                {
                    fail(ctx, "Unmatched ')'");
                    return -1;
                } // if
                break;

            default:
                precedence = find_precedence(token);
                // bogus token, or two operators together.
                if (precedence < 0)
                {
                    pushback(state);
                    fail(ctx, "Invalid expression");
                    return -1;
                } // if

                else  // it's an operator.
                {
                    while (stacksize > 0)
                    {
                        const Token t = stack[stacksize-1];
                        const int p = find_precedence(t);
                        if ( (p >= 0) &&
                             ( ((isleft) && (precedence <= p)) ||
                               ((!isleft) && (precedence < p)) ) )
                        {
                            stacksize--;
                            ADD_TO_OUTPUT(1, t);
                        } // if
                        else
                        {
                            break;
                        } // else
                    } // while
                    PUSH_TO_STACK(token);
                } // else
                break;
        } // switch
        previous_token = token;
    } // while

    while (stacksize > 0)
    {
        const Token t = stack[--stacksize];
        if (t == ((Token) '('))
        {
            fail(ctx, "Unmatched ')'");
            return -1;
        } // if
        ADD_TO_OUTPUT(1, t);
    } // while

    #undef ADD_TO_OUTPUT
    #undef PUSH_TO_STACK

    // okay, you now have some validated data in reverse polish notation.
    #if DEBUG_PREPROCESSOR
    printf("PREPROCESSOR EXPRESSION RPN:");
    int i = 0;
    for (i = 0; i < outputsize; i++)
    {
        if (!output[i].isoperator)
            printf(" %d", output[i].value);
        else
        {
            switch (output[i].value)
            {
                case TOKEN_OROR: printf(" ||"); break;
                case TOKEN_ANDAND: printf(" &&"); break;
                case TOKEN_NEQ: printf(" !="); break;
                case TOKEN_EQL: printf(" =="); break;
                case TOKEN_LEQ: printf(" <="); break;
                case TOKEN_GEQ: printf(" >="); break;
                case TOKEN_LSHIFT: printf(" <<"); break;
                case TOKEN_RSHIFT: printf(" >>"); break;
                case TOKEN_PP_UNARY_PLUS: printf(" +"); break;
                case TOKEN_PP_UNARY_MINUS: printf(" -"); break;
                default: printf(" %c", output[i].value); break;
            } // switch
        } // else
    } // for
    printf("\n");
    #endif

    int error = 0;
    const long val = interpret_rpn(output, outputsize, &error);

    #if DEBUG_PREPROCESSOR
    printf("PREPROCESSOR RPN RESULT: %ld%s\n", val, error ? " (ERROR)" : "");
    #endif

    if (error)
    {
        fail(ctx, "Invalid expression");
        return -1;
    } // if

    return ((val) ? 1 : 0);
}